

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void jx9DelimitNestedTokens
               (SyToken *pIn,SyToken *pEnd,sxu32 nTokStart,sxu32 nTokEnd,SyToken **ppEnd)

{
  int iVar1;
  
  iVar1 = 1;
  for (; pIn < pEnd; pIn = pIn + 1) {
    if ((pIn->nType & nTokStart) == 0) {
      if ((pIn->nType & nTokEnd) != 0) {
        if (iVar1 < 2) break;
        iVar1 = iVar1 + -1;
      }
    }
    else {
      iVar1 = iVar1 + 1;
    }
  }
  *ppEnd = pIn;
  return;
}

Assistant:

JX9_PRIVATE void jx9DelimitNestedTokens(SyToken *pIn,SyToken *pEnd,sxu32 nTokStart,sxu32 nTokEnd,SyToken **ppEnd)
{
	SyToken *pCur = pIn;
	sxi32 iNest = 1;
	for(;;){
		if( pCur >= pEnd ){
			break;
		}
		if( pCur->nType & nTokStart ){
			/* Increment nesting level */
			iNest++;
		}else if( pCur->nType & nTokEnd ){
			/* Decrement nesting level */
			iNest--;
			if( iNest <= 0 ){
				break;
			}
		}
		/* Advance cursor */
		pCur++;
	}
	/* Point to the end of the chunk */
	*ppEnd = pCur;
}